

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O0

void model_rd_for_sb_with_curvfit
               (AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,int plane_from,
               int plane_to,int *out_rate_sum,int64_t *out_dist_sum,uint8_t *skip_txfm_sb,
               int64_t *skip_sse_sb,int *plane_rate,int64_t *plane_sse,int64_t *plane_dist)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  int *in_RCX;
  int64_t *in_RDX;
  BLOCK_SIZE in_SIL;
  int in_R8D;
  int in_R9D;
  undefined4 *in_stack_00000008;
  long *in_stack_00000010;
  long in_stack_00000018;
  long *in_stack_00000020;
  long in_stack_00000028;
  macroblock_plane *p;
  long in_stack_00000038;
  int bh;
  int bw;
  int rate;
  int64_t sse;
  int64_t dist;
  BLOCK_SIZE plane_bsize;
  macroblockd_plane *pd;
  int plane;
  int64_t total_sse;
  int64_t dist_sum;
  int64_t rate_sum;
  int ref;
  undefined1 *puVar3;
  macroblockd_plane *pd_00;
  undefined7 in_stack_ffffffffffffff68;
  BLOCK_SIZE in_stack_ffffffffffffff6f;
  MACROBLOCKD *in_stack_ffffffffffffff70;
  MACROBLOCKD *in_stack_ffffffffffffff80;
  int local_74;
  MACROBLOCKD *in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  int *visible_height;
  long sse_00;
  long lVar4;
  MACROBLOCK *x_00;
  undefined4 in_stack_ffffffffffffffd0;
  
  iVar2 = (int)*(char *)(**(long **)(in_RCX + 0x7ae) + 0x10);
  x_00 = (MACROBLOCK *)0x0;
  lVar4 = 0;
  sse_00 = 0;
  while ((in_R8D <= in_R9D && ((in_R8D == 0 || ((*(byte *)(in_RCX + 3) & 1) != 0))))) {
    visible_height = in_RCX + (long)in_R8D * 0x28c + 4;
    BVar1 = get_plane_block_size(in_SIL,visible_height[1],visible_height[2]);
    puVar3 = &stack0xffffffffffffff88;
    pd_00 = (macroblockd_plane *)&stack0xffffffffffffff84;
    get_txb_dimensions(in_stack_ffffffffffffff80,
                       (int)((ulong)(in_RDX + (long)in_R8D * 0x11) >> 0x20),
                       (BLOCK_SIZE)((ulong)(in_RDX + (long)in_R8D * 0x11) >> 0x18),
                       (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                       (int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f,
                       &in_stack_ffffffffffffff90->mi_row,in_stack_ffffffffffffff98,
                       (int *)CONCAT17(BVar1,in_stack_ffffffffffffffa0),visible_height);
    in_stack_ffffffffffffff90 =
         (MACROBLOCKD *)
         calculate_sse(in_stack_ffffffffffffff70,
                       (macroblock_plane *)
                       CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),pd_00,
                       (int)((ulong)puVar3 >> 0x20),(int)puVar3);
    model_rd_with_curvfit
              ((AV1_COMP *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),x_00,
               (BLOCK_SIZE)((ulong)lVar4 >> 0x38),(int)lVar4,sse_00,in_R8D,in_RCX,in_RDX);
    if (in_R8D == 0) {
      in_stack_ffffffffffffff70 = in_stack_ffffffffffffff90;
      if (0xfffffffe < (long)in_stack_ffffffffffffff90) {
        in_stack_ffffffffffffff70 = (MACROBLOCKD *)0xffffffff;
      }
      *(int *)((long)in_RDX + (long)iVar2 * 4 + 0x25660) = (int)in_stack_ffffffffffffff70;
    }
    sse_00 = (long)(in_stack_ffffffffffffff90->plane[0].pre + -2) + sse_00;
    x_00 = (MACROBLOCK *)((long)&x_00->plane[0].src_diff + (long)local_74);
    lVar4 = (long)in_stack_ffffffffffffff98 + lVar4;
    if (in_stack_00000028 != 0) {
      *(int *)(in_stack_00000028 + (long)in_R8D * 4) = local_74;
    }
    if (p != (macroblock_plane *)0x0) {
      (&p->src_diff)[in_R8D] = (int16_t *)in_stack_ffffffffffffff90;
    }
    if (in_stack_00000038 != 0) {
      *(int **)(in_stack_00000038 + (long)in_R8D * 8) = in_stack_ffffffffffffff98;
    }
    in_R8D = in_R8D + 1;
  }
  if (in_stack_00000018 != 0) {
    *(bool *)in_stack_00000018 = x_00 == (MACROBLOCK *)0x0;
  }
  if (in_stack_00000020 != (long *)0x0) {
    *in_stack_00000020 = sse_00 << 4;
  }
  *in_stack_00000008 = (int)x_00;
  *in_stack_00000010 = lVar4;
  return;
}

Assistant:

static inline void model_rd_for_sb_with_curvfit(
    const AV1_COMP *const cpi, BLOCK_SIZE bsize, MACROBLOCK *x, MACROBLOCKD *xd,
    int plane_from, int plane_to, int *out_rate_sum, int64_t *out_dist_sum,
    uint8_t *skip_txfm_sb, int64_t *skip_sse_sb, int *plane_rate,
    int64_t *plane_sse, int64_t *plane_dist) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  const int ref = xd->mi[0]->ref_frame[0];

  int64_t rate_sum = 0;
  int64_t dist_sum = 0;
  int64_t total_sse = 0;

  for (int plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    int64_t dist, sse;
    int rate;
    int bw, bh;
    const struct macroblock_plane *const p = &x->plane[plane];
    get_txb_dimensions(xd, plane, plane_bsize, 0, 0, plane_bsize, NULL, NULL,
                       &bw, &bh);

    sse = calculate_sse(xd, p, pd, bw, bh);
    model_rd_with_curvfit(cpi, x, plane_bsize, plane, sse, bw * bh, &rate,
                          &dist);

    if (plane == 0) x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

    total_sse += sse;
    rate_sum += rate;
    dist_sum += dist;

    if (plane_rate) plane_rate[plane] = rate;
    if (plane_sse) plane_sse[plane] = sse;
    if (plane_dist) plane_dist[plane] = dist;
  }

  if (skip_txfm_sb) *skip_txfm_sb = rate_sum == 0;
  if (skip_sse_sb) *skip_sse_sb = total_sse << 4;
  *out_rate_sum = (int)rate_sum;
  *out_dist_sum = dist_sum;
}